

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaItemTypeToStr(xmlSchemaTypeType type)

{
  switch(type) {
  case XML_SCHEMA_TYPE_BASIC:
  case XML_SCHEMA_TYPE_SIMPLE:
    return "simple type definition";
  case XML_SCHEMA_TYPE_ANY:
    return (xmlChar *)"wildcard (any)";
  case XML_SCHEMA_TYPE_FACET:
  case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
  case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
  case XML_SCHEMA_TYPE_UR:
  case XML_SCHEMA_TYPE_RESTRICTION:
  case XML_SCHEMA_TYPE_EXTENSION:
  case XML_SCHEMA_TYPE_LIST:
  case XML_SCHEMA_TYPE_UNION:
  case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
    goto switchD_0018adc1_caseD_3;
  case XML_SCHEMA_TYPE_COMPLEX:
    return (xmlChar *)"complex type definition";
  case XML_SCHEMA_TYPE_SEQUENCE:
    return (xmlChar *)"model group (sequence)";
  case XML_SCHEMA_TYPE_CHOICE:
    return (xmlChar *)"model group (choice)";
  case XML_SCHEMA_TYPE_ALL:
    return (xmlChar *)"model group (all)";
  case XML_SCHEMA_TYPE_ELEMENT:
    return "element declaration";
  case XML_SCHEMA_TYPE_ATTRIBUTE:
    return "attribute declaration";
  case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
    return (xmlChar *)"attribute group definition";
  case XML_SCHEMA_TYPE_GROUP:
    return (xmlChar *)"model group definition";
  case XML_SCHEMA_TYPE_NOTATION:
    return (xmlChar *)"notation declaration";
  case XML_SCHEMA_TYPE_IDC_UNIQUE:
    return (xmlChar *)"unique identity-constraint";
  case XML_SCHEMA_TYPE_IDC_KEY:
    return (xmlChar *)"key identity-constraint";
  case XML_SCHEMA_TYPE_IDC_KEYREF:
    return (xmlChar *)"keyref identity-constraint";
  case XML_SCHEMA_TYPE_PARTICLE:
    return "particle";
  case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
    return (xmlChar *)"attribute use";
  default:
    if (type == XML_SCHEMA_EXTRA_QNAMEREF) {
      return (xmlChar *)"[helper component] QName reference";
    }
    if (type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
      return (xmlChar *)"[helper component] attribute use prohibition";
    }
switchD_0018adc1_caseD_3:
    return (xmlChar *)"Not a schema component";
  }
}

Assistant:

static const xmlChar *
xmlSchemaItemTypeToStr(xmlSchemaTypeType type)
{
    switch (type) {
	case XML_SCHEMA_TYPE_BASIC:
	    return(BAD_CAST "simple type definition");
	case XML_SCHEMA_TYPE_SIMPLE:
	    return(BAD_CAST "simple type definition");
	case XML_SCHEMA_TYPE_COMPLEX:
	    return(BAD_CAST "complex type definition");
	case XML_SCHEMA_TYPE_ELEMENT:
	    return(BAD_CAST "element declaration");
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    return(BAD_CAST "attribute use");
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return(BAD_CAST "attribute declaration");
	case XML_SCHEMA_TYPE_GROUP:
	    return(BAD_CAST "model group definition");
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return(BAD_CAST "attribute group definition");
	case XML_SCHEMA_TYPE_NOTATION:
	    return(BAD_CAST "notation declaration");
	case XML_SCHEMA_TYPE_SEQUENCE:
	    return(BAD_CAST "model group (sequence)");
	case XML_SCHEMA_TYPE_CHOICE:
	    return(BAD_CAST "model group (choice)");
	case XML_SCHEMA_TYPE_ALL:
	    return(BAD_CAST "model group (all)");
	case XML_SCHEMA_TYPE_PARTICLE:
	    return(BAD_CAST "particle");
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	    return(BAD_CAST "unique identity-constraint");
	    /* return(BAD_CAST "IDC (unique)"); */
	case XML_SCHEMA_TYPE_IDC_KEY:
	    return(BAD_CAST "key identity-constraint");
	    /* return(BAD_CAST "IDC (key)"); */
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return(BAD_CAST "keyref identity-constraint");
	    /* return(BAD_CAST "IDC (keyref)"); */
	case XML_SCHEMA_TYPE_ANY:
	    return(BAD_CAST "wildcard (any)");
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return(BAD_CAST "[helper component] QName reference");
	case XML_SCHEMA_EXTRA_ATTR_USE_PROHIB:
	    return(BAD_CAST "[helper component] attribute use prohibition");
	default:
	    return(BAD_CAST "Not a schema component");
    }
}